

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void apply_aug(lys_node_augment *augment)

{
  lys_node *plVar1;
  lys_node *last;
  lys_node_augment *augment_local;
  
  if ((augment->target != (lys_node *)0x0) && ((augment->flags & 1) != 0)) {
    if (augment->target->child == (lys_node *)0x0) {
      augment->target->child = augment->child;
    }
    else {
      plVar1 = augment->target->child->prev;
      plVar1->next = augment->child;
      augment->target->child->prev = augment->child->prev;
      augment->child->prev = plVar1;
    }
    augment->flags = augment->flags & 0xfffe;
    return;
  }
  __assert_fail("augment->target && (augment->flags & LYS_NOTAPPLIED)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0xfb1,"void apply_aug(struct lys_node_augment *)");
}

Assistant:

static void
apply_aug(struct lys_node_augment *augment)
{
    struct lys_node *last;

    assert(augment->target && (augment->flags & LYS_NOTAPPLIED));

    /* reconnect augmenting data into the target - add them to the target child list */
    if (augment->target->child) {
        last = augment->target->child->prev;
        last->next = augment->child;
        augment->target->child->prev = augment->child->prev;
        augment->child->prev = last;
    } else {
        augment->target->child = augment->child;
    }

    /* remove the flag about not applicability */
    augment->flags &= ~LYS_NOTAPPLIED;
}